

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

void __thiscall QUrl::detach(QUrl *this)

{
  long lVar1;
  void *pvVar2;
  QUrlPrivate *in_RDI;
  QUrlPrivate **unaff_retaddr;
  
  lVar1._0_4_ = in_RDI->ref;
  lVar1._4_4_ = in_RDI->port;
  if (lVar1 == 0) {
    pvVar2 = operator_new(0xc0);
    QUrlPrivate::QUrlPrivate(in_RDI);
    *(void **)in_RDI = pvVar2;
  }
  else {
    qAtomicDetach<QUrlPrivate>(unaff_retaddr);
  }
  return;
}

Assistant:

void QUrl::detach()
{
    if (!d)
        d = new QUrlPrivate;
    else
        qAtomicDetach(d);
}